

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_b9a119::Helper::GetDestination
          (string *__return_storage_ptr__,Helper *this,cmInstallCommandArguments *args,
          string *varName,string *guess)

{
  ulong uVar1;
  string *psVar2;
  string local_50 [8];
  string val;
  string *guess_local;
  string *varName_local;
  cmInstallCommandArguments *args_local;
  Helper *this_local;
  
  val.field_2._8_8_ = guess;
  if (args != (cmInstallCommandArguments *)0x0) {
    cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
      return __return_storage_ptr__;
    }
  }
  psVar2 = cmMakefile::GetSafeDefinition(this->Makefile,varName);
  std::__cxx11::string::string(local_50,(string *)psVar2);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_50);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val.field_2._8_8_);
  }
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetDestination(const cmInstallCommandArguments* args,
                                   const std::string& varName,
                                   const std::string& guess) const
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  std::string val = this->Makefile->GetSafeDefinition(varName);
  if (!val.empty()) {
    return val;
  }
  return guess;
}